

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDocked(ImGuiWindow_conflict *window,_Bool *p_open)

{
  byte bVar1;
  ImGuiTabBar *tab_bar;
  ImGuiContext_conflict1 *ctx;
  ImGuiContext_conflict1 *pIVar2;
  _Bool _Var3;
  ImGuiID IVar4;
  ImU32 IVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ImGuiContext_conflict1 *g;
  ImGuiDockNode *pIVar9;
  ImGuiTabItem *it;
  ImGuiDockNode *pIVar10;
  char cVar11;
  undefined1 extraout_DL;
  undefined1 clear_persistent_docking_ref;
  undefined1 extraout_DL_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar12;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  short sVar13;
  long lVar14;
  ImGuiDockNode *node;
  
  ctx = GImGui;
  window->field_0x3e1 = window->field_0x3e1 & 0xf8;
  _Var3 = GetWindowAlwaysWantOwnTabBar(window);
  uVar12 = extraout_RDX;
  if (_Var3) {
    if (window->DockId == 0) {
      if (window->DockNode != (ImGuiDockNode *)0x0) {
        __assert_fail("window->DockNode == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3e56,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      IVar4 = DockContextGenNodeID(ctx);
      window->DockId = IVar4;
      uVar12 = extraout_RDX_00;
    }
  }
  else {
    cVar11 = '\0';
    if ((((ctx->NextWindowData).Flags & 1) != 0) &&
       (uVar12 = (ulong)(uint)(int)(char)window->field_0xec,
       ((ctx->NextWindowData).PosCond & (int)(char)window->field_0xec) != 0)) {
      cVar11 = (ctx->NextWindowData).PosUndock;
    }
    clear_persistent_docking_ref = (undefined1)uVar12;
    if (cVar11 != '\0' || ((uint)window->Flags >> 0x15 & 1) != 0) goto LAB_001bcfad;
  }
  pIVar9 = window->DockNode;
  IVar4 = window->DockId;
  if (pIVar9 == (ImGuiDockNode *)0x0) {
    if (IVar4 == 0) {
      pIVar9 = (ImGuiDockNode *)0x0;
    }
    else {
      pIVar9 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,IVar4);
      if (pIVar9 == (ImGuiDockNode *)0x0) {
        pIVar9 = DockContextAddNode(ctx,IVar4);
        uVar8 = *(uint *)&pIVar9->field_0xbc & 0xfffffe00 | 0x92;
        pIVar10 = (ImGuiDockNode *)(ulong)uVar8;
        *(short *)&pIVar9->field_0xbc = (short)uVar8;
        pIVar9->LastFrameAlive = ctx->FrameCount;
      }
      else {
        clear_persistent_docking_ref = extraout_DL_00;
        if (pIVar9->ChildNodes[0] != (ImGuiDockNode *)0x0) goto LAB_001bcfad;
        pIVar10 = (ImGuiDockNode *)(ulong)*(ushort *)&pIVar9->field_0xbc;
      }
      node = pIVar9;
      if (((uint)pIVar10 >> 9 & 1) == 0) {
        while (((uint)pIVar10 >> 9 & 1) == 0) {
          *(ushort *)&node->field_0xbc = (ushort)pIVar10 | 0x200;
          node->field_0xbe = node->field_0xbe | 8;
          if (node->ParentNode != (ImGuiDockNode *)0x0) {
            node = node->ParentNode;
          }
          pIVar10 = (ImGuiDockNode *)(ulong)*(ushort *)&node->field_0xbc;
        }
        if (((node->Size).x <= 0.0) || ((node->Size).y <= 0.0)) {
          __assert_fail("ancestor_node->Size.x > 0.0f && ancestor_node->Size.y > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3e3e,
                        "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                       );
        }
        pIVar10 = DockNodeGetRootNode(pIVar10);
        DockNodeUpdateHasCentralNodeChild(pIVar10);
        DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,true);
      }
      DockNodeAddWindow(pIVar9,window,true);
      if (pIVar9 != window->DockNode) {
        __assert_fail("node == window->DockNode",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3e45,
                      "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                     );
      }
      uVar12 = extraout_RDX_02;
      if (pIVar9 == (ImGuiDockNode *)0x0) {
        return;
      }
    }
  }
  else if (IVar4 != pIVar9->ID) {
    __assert_fail("window->DockId == node->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3e6a,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (pIVar9->LastFrameAlive < ctx->FrameCount) {
    pIVar9 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)(uint)pIVar9->LastFrameAlive);
    clear_persistent_docking_ref = extraout_DL;
    if (ctx->FrameCount <= pIVar9->LastFrameAlive) {
      window->field_0x3e1 = window->field_0x3e1 | 1;
      return;
    }
LAB_001bcfad:
    DockContextProcessUndockWindow
              ((ImGuiContext_conflict1 *)window,(ImGuiWindow_conflict *)0x1,
               (_Bool)clear_persistent_docking_ref);
    return;
  }
  for (lVar14 = 0; clear_persistent_docking_ref = (undefined1)uVar12, lVar14 != 0x18;
      lVar14 = lVar14 + 4) {
    IVar5 = ColorConvertFloat4ToU32
                      ((ctx->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar14));
    *(ImU32 *)((long)(window->DockStyle).Colors + lVar14) = IVar5;
    uVar12 = extraout_RDX_01;
  }
  if (pIVar9->HostWindow == (ImGuiWindow_conflict *)0x0) {
    if (pIVar9->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing) {
      window->field_0x3e1 = window->field_0x3e1 | 1;
    }
    if ((pIVar9->Windows).Size < 2) {
      return;
    }
    window->Hidden = true;
    window->HiddenFramesCanSkipItems = '\x02' - window->Active;
    return;
  }
  if (pIVar9->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    __assert_fail("node->IsLeafNode()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3e9a,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (((pIVar9->Size).x < 0.0) || ((pIVar9->Size).y < 0.0)) {
    __assert_fail("node->Size.x >= 0.0f && node->Size.y >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3e9b,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  pIVar9->State = ImGuiDockNodeState_HostWindowVisible;
  pIVar2 = GImGui;
  if (window->BeginOrderWithinContext < pIVar9->HostWindow->BeginOrderWithinContext)
  goto LAB_001bcfad;
  uVar8 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar8 | 1;
  (pIVar2->NextWindowData).PosVal = pIVar9->Pos;
  (pIVar2->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar2->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar2->NextWindowData).PosCond = 1;
  (pIVar2->NextWindowData).PosUndock = true;
  (pIVar2->NextWindowData).Flags = uVar8 | 3;
  (pIVar2->NextWindowData).SizeVal = pIVar9->Size;
  (pIVar2->NextWindowData).SizeCond = 1;
  (ctx->NextWindowData).PosUndock = false;
  bVar1 = window->field_0x3e1;
  window->field_0x3e1 = bVar1 & 0xf8 | 3;
  if ((pIVar9->MergedFlags & 1) != 0) {
    return;
  }
  if (pIVar9->VisibleWindow == window) {
    window->field_0x3e1 = bVar1 | 7;
  }
  uVar8 = window->Flags;
  if ((uVar8 >> 0x18 & 1) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_ChildWindow) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3eb4,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  uVar6 = uVar8 | 0x1010003;
  if ((pIVar9->MergedFlags & 0x3000) == 0) {
    uVar6 = uVar8 & 0xfefefffc | 0x1010002;
  }
  window->Flags = uVar6;
  if ((pIVar9->TabBar != (ImGuiTabBar *)0x0) && (window->WasActive == true)) {
    tab_bar = window->DockNode->TabBar;
    sVar13 = -1;
    if ((tab_bar != (ImGuiTabBar *)0x0) &&
       (it = TabBarFindTabByID(tab_bar,window->ID), it != (ImGuiTabItem *)0x0)) {
      iVar7 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
      sVar13 = (short)iVar7;
    }
    window->DockOrder = sVar13;
  }
  if ((pIVar9->field_0xbd & 0x40) == 0) {
    if ((p_open == (_Bool *)0x0) || (pIVar9->WantCloseTabId != window->ID)) goto LAB_001bd0f0;
  }
  else if (p_open == (_Bool *)0x0) goto LAB_001bd0f0;
  *p_open = false;
LAB_001bd0f0:
  IVar4 = ImGuiWindow::GetID((ImGuiWindow *)window->DockNode->HostWindow,window->Name,(char *)0x0);
  window->ChildId = IVar4;
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    // Clear fields ahead so most early-out paths don't have to do it
    window->DockIsActive = window->DockNodeIsVisible = window->DockTabIsVisible = false;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextNewFrameUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
            DockContextProcessUndockWindow(ctx, window);
        else
            window->DockIsActive = true;
        return;
    }

    // Store style overrides
    for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
        window->DockStyle.Colors[color_n] = ColorConvertFloat4ToU32(g.Style.Colors[GWindowDockStyleColors[color_n]]);

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        if (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing)
            window->DockIsActive = true;
        if (node->Windows.Size > 1)
            DockNodeHideWindowDuringHostWindowCreation(window);
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockNodeIsVisible = true;
    window->DockTabIsVisible = false;
    if (node->MergedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the window has been visible once already
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && window->WasActive)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabId == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}